

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineWriter::Flush(InlineWriter *this,int param_2)

{
  int iVar1;
  ostream *poVar2;
  long in_RDI;
  ScopedTimer __var2174;
  void *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  
  if (Flush(int)::__var174 == '\0') {
    iVar1 = __cxa_guard_acquire(&Flush(int)::__var174);
    if (iVar1 != 0) {
      Flush::__var174 = (void *)ps_timer_create_("InlineWriter::Flush");
      __cxa_guard_release(&Flush(int)::__var174);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(int *)(in_RDI + 0xc0) == 5) {
    in_stack_ffffffffffffffc0 = std::operator<<((ostream *)&std::cout,"Inline Writer ");
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffc0,*(int *)(in_RDI + 0xc4));
    std::operator<<(poVar2,"   Flush()\n");
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void InlineWriter::Flush(const int)
{
    PERFSTUBS_SCOPED_TIMER("InlineWriter::Flush");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Writer " << m_WriterRank << "   Flush()\n";
    }
}